

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatBackup.cpp
# Opt level: O2

void __thiscall FatBackup::backup(FatBackup *this,string *backupFile,int fat)

{
  FatSystem *this_00;
  unsigned_long_long uVar1;
  uint uVar2;
  FILE *__stream;
  ostream *poVar3;
  undefined8 uVar4;
  int size;
  int iVar5;
  long lVar6;
  int i;
  int iVar7;
  ostringstream oss;
  char buffer [1024];
  
  uVar1 = ((this->super_FatModule).system)->fatSize;
  __stream = fopen((backupFile->_M_dataplus)._M_p,"w+");
  iVar5 = (int)uVar1 << (fat == 0);
  if (fat == 2) {
    lVar6 = (long)(int)((this->super_FatModule).system)->fatSize;
  }
  else {
    lVar6 = 0;
  }
  if (__stream != (FILE *)0x0) {
    for (iVar7 = 0; size = iVar5 - iVar7, size != 0 && iVar7 <= iVar5; iVar7 = iVar7 + uVar2) {
      if (0x3ff < size) {
        size = 0x400;
      }
      this_00 = (this->super_FatModule).system;
      uVar2 = FatSystem::readData(this_00,iVar7 + lVar6 + this_00->fatStart,buffer,size);
      if (0 < (int)uVar2) {
        fwrite(buffer,(ulong)uVar2,1,__stream);
      }
    }
    fclose(__stream);
    poVar3 = std::operator<<((ostream *)&std::cout,"Successfully wrote ");
    poVar3 = std::operator<<(poVar3,(string *)backupFile);
    poVar3 = std::operator<<(poVar3," (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
    poVar3 = std::operator<<(poVar3,")");
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Unable to open file ");
  poVar3 = std::operator<<(poVar3,(string *)backupFile);
  std::operator<<(poVar3," for writing");
  uVar4 = __cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  __cxa_throw(uVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void FatBackup::backup(string backupFile, int fat)
{
    char buffer[CHUNKS_SIZES];
    int size = system.fatSize;
    int n = 0;
    int offset = 0;
    FILE *backup = fopen(backupFile.c_str(), "w+");

    if (fat == 0) {
        size *= 2;
    } 
    if (fat == 2) {
        offset = system.fatSize;
    }

    if (backup == NULL) {
        ostringstream oss;
        oss << "Unable to open file " << backupFile << " for writing";
        throw oss.str();
    }

    for (int i=0; i<size; i+=n) {
        int toRead = CHUNKS_SIZES;
        if (size-i < toRead) {
            toRead = size-i;
        }
        n = system.readData(system.fatStart+i+offset, buffer, toRead);
        if (n > 0) {
            fwrite(buffer, n, 1, backup);
        }
    }

    fclose(backup);
    cout << "Successfully wrote " << backupFile << " (" << size << ")" << endl;
}